

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall chrono::robosimian::RoboSimian::Initialize(RoboSimian *this,ChCoordsys<double> *pos)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3
  ;
  element_type *peVar4;
  long lVar5;
  __cxx11 local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [36];
  int local_16c;
  undefined1 local_168 [4];
  int i;
  ChVector<double> local_150;
  shared_ptr<chrono::ChBodyAuxRef> local_138;
  ChVector<double> local_128;
  ChVector<double> local_110;
  shared_ptr<chrono::ChBodyAuxRef> local_f8;
  ChVector<double> local_e8;
  ChVector<double> local_d0;
  shared_ptr<chrono::ChBodyAuxRef> local_b8;
  ChVector<double> local_a8;
  ChVector<double> local_90;
  shared_ptr<chrono::ChBodyAuxRef> local_78;
  ChVector<double> local_68;
  ChVector<double> local_40;
  shared_ptr<chrono::ChBodyAuxRef> local_28;
  ChCoordsys<double> *local_18;
  ChCoordsys<double> *pos_local;
  RoboSimian *this_local;
  
  local_18 = pos;
  pos_local = (ChCoordsys<double> *)this;
  peVar2 = std::
           __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_chassis);
  RS_Chassis::Initialize(peVar2,local_18);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_sled);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_sled);
    peVar2 = std::
             __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_chassis);
    std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&local_28,&(peVar2->super_RS_Part).m_body);
    ChVector<double>::ChVector(&local_40,0.0,0.0,0.21);
    ChVector<double>::ChVector(&local_68,1.570796,0.0,0.0);
    RS_Sled::Initialize(this_00,&local_28,&local_40,&local_68);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&local_28);
  }
  p_Var3 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,0);
  peVar4 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var3);
  peVar2 = std::
           __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_chassis);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&local_78,&(peVar2->super_RS_Part).m_body);
  ChVector<double>::ChVector(&local_90,0.29326,0.2094,0.0365);
  ChVector<double>::ChVector(&local_a8,0.0,-1.5708,-0.2618);
  RS_Limb::Initialize(peVar4,&local_78,&local_90,&local_a8,LIMB_FR,this->m_wheel_mode);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&local_78);
  p_Var3 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,1);
  peVar4 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var3);
  peVar2 = std::
           __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_chassis);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&local_b8,&(peVar2->super_RS_Part).m_body);
  ChVector<double>::ChVector(&local_d0,-0.29326,0.2094,0.0365);
  ChVector<double>::ChVector(&local_e8,0.0,-1.5708,0.2618);
  RS_Limb::Initialize(peVar4,&local_b8,&local_d0,&local_e8,LIMB_RR,this->m_wheel_mode);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&local_b8);
  p_Var3 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,2);
  peVar4 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var3);
  peVar2 = std::
           __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_chassis);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&local_f8,&(peVar2->super_RS_Part).m_body);
  ChVector<double>::ChVector(&local_110,-0.29326,-0.2094,0.0365);
  ChVector<double>::ChVector(&local_128,0.0,-1.5708,2.87979);
  RS_Limb::Initialize(peVar4,&local_f8,&local_110,&local_128,LIMB_RL,this->m_wheel_mode);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&local_f8);
  p_Var3 = (__shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)std::
              vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
              ::operator[](&this->m_limbs,3);
  peVar4 = std::
           __shared_ptr_access<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Var3);
  peVar2 = std::
           __shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_chassis);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&local_138,&(peVar2->super_RS_Part).m_body);
  ChVector<double>::ChVector(&local_150,0.29326,-0.2094,0.0365);
  ChVector<double>::ChVector((ChVector<double> *)local_168,0.0,-1.5708,3.40339);
  RS_Limb::Initialize(peVar4,&local_138,&local_150,(ChVector<double> *)local_168,LIMB_FL,
                      this->m_wheel_mode);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&local_138);
  for (local_16c = 0; local_16c < 4; local_16c = local_16c + 1) {
    lVar5 = (long)local_16c;
    std::operator+(local_210,(char *)&this->m_outdir);
    std::operator+(local_1f0,local_210);
    std::operator+(local_1d0,(char *)local_1f0);
    std::__cxx11::to_string(local_230,local_16c);
    std::operator+(local_1b0,local_1d0);
    std::operator+(local_190,(char *)local_1b0);
    std::ofstream::open(&this->field_0x108 + lVar5 * 0x200,local_190,0x10);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::__cxx11::string::~string((string *)local_210);
    std::ios_base::precision
              ((ios_base *)
               ((long)(&this->field_0x108 + (long)local_16c * 0x200) +
               *(long *)(*(long *)(&this->field_0x108 + (long)local_16c * 0x200) + -0x18)),7);
    std::ostream::operator<<
              ((ostream *)(&this->field_0x108 + (long)local_16c * 0x200),std::scientific);
  }
  return;
}

Assistant:

void RoboSimian::Initialize(const ChCoordsys<>& pos) {
    m_chassis->Initialize(pos);

    if (m_sled)
        m_sled->Initialize(m_chassis->m_body, ChVector<>(0.0, 0.0, 0.21), ChVector<>(1.570796, 0, 0));

    m_limbs[FR]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, -0.26180), CollisionFamily::LIMB_FR, m_wheel_mode);
    m_limbs[RR]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, +0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, +0.26180), CollisionFamily::LIMB_RR, m_wheel_mode);
    m_limbs[RL]->Initialize(m_chassis->m_body, ChVector<>(-0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 2.87979), CollisionFamily::LIMB_RL, m_wheel_mode);
    m_limbs[FL]->Initialize(m_chassis->m_body, ChVector<>(+0.29326, -0.20940, 0.03650),
                            ChVector<>(0.00000, -1.57080, 3.40339), CollisionFamily::LIMB_FL, m_wheel_mode);

    ////m_wheel_left->Initialize(m_chassis->m_body, ChVector<>(-0.42943, -0.19252, 0.06380),
    ////                         ChVector<>(0.00000, +1.57080, -1.57080));
    ////m_wheel_right->Initialize(m_chassis->m_body, ChVector<>(-0.42943, +0.19252, 0.06380),
    ////                          ChVector<>(0.00000, -1.57080, -1.57080));

    // Create output files
    for (int i = 0; i < 4; i++) {
        m_outf[i].open(m_outdir + "/" + m_root + "_limb" + std::to_string(i) + ".dat");
        m_outf[i].precision(7);
        m_outf[i] << std::scientific;
    }
}